

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

bool __thiscall google::protobuf::io::CordOutputStream::WriteCord(CordOutputStream *this,Cord *cord)

{
  CordBuffer local_28;
  Cord *local_18;
  Cord *cord_local;
  CordOutputStream *this_local;
  
  local_18 = cord;
  cord_local = (Cord *)this;
  absl::lts_20240722::CordBuffer::CordBuffer(&local_28,&this->buffer_);
  absl::lts_20240722::Cord::Append(&this->cord_,&local_28);
  absl::lts_20240722::CordBuffer::~CordBuffer(&local_28);
  absl::lts_20240722::Cord::Append(&this->cord_);
  this->state_ = kSteal;
  return true;
}

Assistant:

bool CordOutputStream::WriteCord(const absl::Cord& cord) {
  cord_.Append(std::move(buffer_));
  cord_.Append(cord);
  state_ = State::kSteal;  // Attempt to utilize existing capacity in `cord'
  return true;
}